

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void __thiscall ACSStringPool::ReadStrings(ACSStringPool *this,PNGHandle *png,DWORD id)

{
  PoolEntry *pPVar1;
  char *data;
  uint uVar2;
  DWORD DVar3;
  DWORD DVar4;
  size_t len;
  long lVar5;
  ulong uVar6;
  uint *puVar7;
  uint uVar8;
  char *str;
  int32_t poolsize;
  FPNGChunkArchive arc;
  char *local_340;
  uint local_334;
  FPNGChunkArchive local_330;
  
  uVar2 = (this->Pool).Count;
  if (uVar2 != 0) {
    TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::DoDelete(&this->Pool,0,uVar2 - 1);
    (this->Pool).Count = 0;
  }
  memset(this->PoolBuckets,0xff,0x3ec);
  this->FirstFreeEntry = 0;
  uVar2 = M_FindPNGChunk(png,id);
  if (uVar2 != 0) {
    FPNGChunkArchive::FPNGChunkArchive(&local_330,png->File->File,id,(ulong)uVar2);
    local_340 = (char *)0x0;
    FArchive::operator<<(&local_330.super_FArchive,&local_334);
    TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::Resize(&this->Pool,local_334);
    uVar2 = FArchive::ReadCount(&local_330.super_FArchive);
    if (-1 < (int)uVar2) {
      uVar8 = 0;
      do {
        if ((int)uVar8 < (int)uVar2) {
          puVar7 = &(this->Pool).Array[(int)uVar8].LockCount;
          lVar5 = (ulong)uVar2 - (long)(int)uVar8;
          do {
            *(undefined8 *)(puVar7 + -1) = 0xfffffffe;
            puVar7 = puVar7 + 6;
            lVar5 = lVar5 + -1;
            uVar8 = uVar2;
          } while (lVar5 != 0);
        }
        FArchive::operator<<(&local_330.super_FArchive,&local_340);
        data = local_340;
        len = strlen(local_340);
        DVar3 = SuperFastHash(data,len);
        FString::operator=(&(this->Pool).Array[(int)uVar8].Str,local_340);
        (this->Pool).Array[(int)uVar8].Hash = DVar3;
        DVar4 = FArchive::ReadCount(&local_330.super_FArchive);
        pPVar1 = (this->Pool).Array;
        pPVar1[(int)uVar8].LockCount = DVar4;
        pPVar1[(int)uVar8].Next = this->PoolBuckets[DVar3 % 0xfb];
        this->PoolBuckets[DVar3 % 0xfb] = uVar8;
        uVar2 = FArchive::ReadCount(&local_330.super_FArchive);
        uVar8 = uVar8 + 1;
      } while (-1 < (int)uVar2);
      if (local_340 != (char *)0x0) {
        operator_delete__(local_340);
      }
    }
    uVar2 = (this->Pool).Count;
    if ((ulong)uVar2 == 0) {
      uVar6 = 0;
    }
    else {
      puVar7 = &((this->Pool).Array)->Next;
      uVar6 = 0;
      do {
        if (*puVar7 == 0xfffffffe) goto LAB_00500242;
        uVar6 = uVar6 + 1;
        puVar7 = puVar7 + 6;
      } while (uVar2 != uVar6);
      uVar6 = (ulong)uVar2;
    }
LAB_00500242:
    this->FirstFreeEntry = (uint)uVar6;
    FPNGChunkArchive::~FPNGChunkArchive(&local_330);
  }
  return;
}

Assistant:

void ACSStringPool::ReadStrings(PNGHandle *png, DWORD id)
{
	Clear();

	size_t len = M_FindPNGChunk(png, id);
	if (len != 0)
	{
		FPNGChunkArchive arc(png->File->GetFile(), id, len);
		int32_t i, j, poolsize;
		unsigned int h, bucketnum;
		char *str = NULL;

		arc << poolsize;

		Pool.Resize(poolsize);
		i = 0;
		j = arc.ReadCount();
		while (j >= 0)
		{
			// Mark skipped entries as free
			for (; i < j; ++i)
			{
				Pool[i].Next = FREE_ENTRY;
				Pool[i].LockCount = 0;
			}
			arc << str;
			h = SuperFastHash(str, strlen(str));
			bucketnum = h % NUM_BUCKETS;
			Pool[i].Str = str;
			Pool[i].Hash = h;
			Pool[i].LockCount = arc.ReadCount();
			Pool[i].Next = PoolBuckets[bucketnum];
			PoolBuckets[bucketnum] = i;
			i++;
			j = arc.ReadCount();
		}
		if (str != NULL)
		{
			delete[] str;
		}
		FindFirstFreeEntry(0);
	}
}